

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

void __thiscall soul::StructuralParser::parseStructDeclaration(StructuralParser *this)

{
  void **this_00;
  ModuleBase *pMVar1;
  bool bVar2;
  Identifier IVar3;
  PoolItem *pPVar4;
  Expression *type;
  Context context;
  Context local_60;
  Context local_48;
  
  local_48.location.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object;
  if (local_48.location.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_48.location.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_48.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_48.location.location.data = (this->super_SOULTokeniser).location.location.data;
  local_48.parentScope = this->currentScope;
  IVar3 = parseIdentifier(this);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x289d4b);
  pPVar4 = PoolAllocator::allocateSpaceForObject(&this->allocator->pool,0x2e0);
  this_00 = &pPVar4->item;
  AST::StructDeclaration::StructDeclaration((StructDeclaration *)this_00,&local_48,IVar3);
  pPVar4->destructor =
       PoolAllocator::
       allocate<soul::AST::StructDeclaration,_soul::AST::Context_&,_soul::Identifier_&>::
       anon_class_1_0_00000001::__invoke;
  pMVar1 = (this->module).object;
  if (pMVar1 != (ModuleBase *)0x0) {
    local_60.location.sourceCode.object = (SourceCodeText *)this_00;
    std::
    vector<soul::pool_ref<soul::AST::StructDeclaration>,std::allocator<soul::pool_ref<soul::AST::StructDeclaration>>>
    ::emplace_back<soul::pool_ref<soul::AST::StructDeclaration>>
              ((vector<soul::pool_ref<soul::AST::StructDeclaration>,std::allocator<soul::pool_ref<soul::AST::StructDeclaration>>>
                *)&pMVar1->structures,(pool_ref<soul::AST::StructDeclaration> *)&local_60);
    while( true ) {
      bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2886a0);
      if (bVar2) break;
      type = parseType(this,structMember);
      do {
        local_60.location.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object
        ;
        if (local_60.location.sourceCode.object != (SourceCodeText *)0x0) {
          ((local_60.location.sourceCode.object)->super_RefCountedObject).refCount =
               ((local_60.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
        }
        local_60.location.location.data = (this->super_SOULTokeniser).location.location.data;
        local_60.parentScope = this->currentScope;
        IVar3 = parseIdentifier(this);
        AST::StructDeclaration::addMember((StructDeclaration *)this_00,type,&local_60,IVar3);
        RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_60.location.sourceCode.object);
        bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x289d49);
      } while (bVar2);
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2881d4);
    }
    giveErrorOnSemicolon(this);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_48.location.sourceCode.object);
    return;
  }
  throwInternalCompilerError("object != nullptr","operator->",0x3c);
}

Assistant:

void parseStructDeclaration()
    {
        auto context = getContext();
        auto name = parseIdentifier();
        expect (Operator::openBrace);

        auto& newStruct = allocate<AST::StructDeclaration> (context, name);
        module->structures.push_back (newStruct);

        while (! matchIf (Operator::closeBrace))
        {
            auto& type = parseType (ParseTypeContext::structMember);

            for (;;)
            {
                newStruct.addMember (type, getContext(), parseIdentifier());

                if (matchIf (Operator::comma))
                    continue;

                expect (Operator::semicolon);
                break;
            }
        }

        giveErrorOnSemicolon();
    }